

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinclude.c
# Opt level: O2

int xmlXIncludeDoProcess(xmlXIncludeCtxtPtr ctxt,xmlNodePtr tree)

{
  _xmlNode *p_Var1;
  int iVar2;
  int iVar3;
  xmlXIncludeRefPtr pxVar4;
  xmlNodePtr pxVar5;
  ulong uVar6;
  xmlNodePtr pxVar7;
  xmlNodePtr pxVar8;
  xmlNodePtr pxVar9;
  char *pcVar10;
  _xmlNode *p_Var11;
  long lVar12;
  _xmlNode **pp_Var13;
  xmlNodePtr cur;
  
  lVar12 = (long)ctxt->incNr;
  p_Var11 = tree;
  do {
    if ((((p_Var11 == (xmlNodePtr)0x0) || (p_Var11->type != XML_ELEMENT_NODE)) ||
        (p_Var11->ns == (xmlNs *)0x0)) ||
       ((iVar2 = xmlStrEqual(p_Var11->ns->href,(xmlChar *)"http://www.w3.org/2003/XInclude"),
        iVar2 == 0 &&
        (iVar2 = xmlStrEqual(p_Var11->ns->href,(xmlChar *)"http://www.w3.org/2001/XInclude"),
        iVar2 == 0)))) {
LAB_001abb67:
      if ((p_Var11->children == (xmlNodePtr)0x0) ||
         (pxVar5 = p_Var11->children, (p_Var11->type | XML_COMMENT_NODE) != XML_DOCUMENT_NODE))
      goto LAB_001abb7c;
    }
    else {
      iVar2 = xmlStrEqual(p_Var11->ns->href,(xmlChar *)"http://www.w3.org/2001/XInclude");
      if ((iVar2 != 0) && (ctxt->legacy == 0)) {
        ctxt->legacy = 1;
      }
      iVar2 = xmlStrEqual(p_Var11->name,(xmlChar *)"include");
      if (iVar2 == 0) {
        iVar2 = xmlStrEqual(p_Var11->name,(xmlChar *)"fallback");
        if ((iVar2 != 0) &&
           (((p_Var1 = p_Var11->parent, p_Var1 == (_xmlNode *)0x0 ||
             (p_Var1->type != XML_ELEMENT_NODE)) ||
            ((p_Var1->ns == (xmlNs *)0x0 ||
             (((iVar2 = xmlStrEqual(p_Var1->ns->href,(xmlChar *)"http://www.w3.org/2003/XInclude"),
               iVar2 == 0 &&
               (iVar2 = xmlStrEqual(p_Var11->parent->ns->href,
                                    (xmlChar *)"http://www.w3.org/2001/XInclude"), iVar2 == 0)) ||
              (iVar2 = xmlStrEqual(p_Var11->parent->name,(xmlChar *)"include"), iVar2 == 0)))))))) {
          xmlXIncludeErr(ctxt,p_Var11,0x650,"%s is not the child of an \'include\'\n",
                         (xmlChar *)"fallback");
        }
        goto LAB_001abb67;
      }
      iVar2 = 0;
      pp_Var13 = &p_Var11->children;
      while (p_Var1 = *pp_Var13, p_Var1 != (_xmlNode *)0x0) {
        if (((p_Var1->type == XML_ELEMENT_NODE) && (p_Var1->ns != (xmlNs *)0x0)) &&
           ((iVar3 = xmlStrEqual(p_Var1->ns->href,(xmlChar *)"http://www.w3.org/2003/XInclude"),
            iVar3 != 0 ||
            (iVar3 = xmlStrEqual(p_Var1->ns->href,(xmlChar *)"http://www.w3.org/2001/XInclude"),
            iVar3 != 0)))) {
          iVar3 = xmlStrEqual(p_Var1->name,(xmlChar *)"include");
          if (iVar3 != 0) {
            iVar2 = 0x64e;
            pcVar10 = "%s has an \'include\' child\n";
            goto LAB_001abb54;
          }
          iVar3 = xmlStrEqual(p_Var1->name,(xmlChar *)"fallback");
          iVar2 = (iVar2 + 1) - (uint)(iVar3 == 0);
        }
        pp_Var13 = &p_Var1->next;
      }
      if (1 < iVar2) {
        iVar2 = 0x64f;
        pcVar10 = "%s has multiple fallback children\n";
LAB_001abb54:
        xmlXIncludeErr(ctxt,p_Var11,iVar2,pcVar10,(xmlChar *)"include");
        goto LAB_001abb67;
      }
      pxVar4 = xmlXIncludeExpandNode(ctxt,p_Var11);
      if (pxVar4 != (xmlXIncludeRefPtr)0x0) {
        pxVar4->replace = 1;
      }
LAB_001abb7c:
      while ((pxVar5 = p_Var11, p_Var11 != tree &&
             (pxVar5 = p_Var11->next, p_Var11->next == (xmlNodePtr)0x0))) {
        p_Var11 = p_Var11->parent;
        if (p_Var11 == (_xmlNode *)0x0) goto LAB_001abba9;
      }
    }
  } while ((pxVar5 != (xmlNodePtr)0x0) && (p_Var11 = pxVar5, pxVar5 != tree));
LAB_001abba9:
  iVar2 = 0;
  do {
    uVar6 = (ulong)ctxt->incNr;
    if ((long)uVar6 <= lVar12) {
      if (ctxt->isStream != 0) {
        for (lVar12 = 0; lVar12 < (int)uVar6; lVar12 = lVar12 + 1) {
          xmlXIncludeFreeRef(ctxt->incTab[lVar12]);
          uVar6 = (ulong)(uint)ctxt->incNr;
        }
        ctxt->incNr = 0;
      }
      return iVar2;
    }
    pxVar4 = ctxt->incTab[lVar12];
    if (pxVar4->replace == 0) {
      if (pxVar4->inc != (xmlNodePtr)0x0) {
        xmlFreeNodeList(pxVar4->inc);
        ctxt->incTab[lVar12]->inc = (xmlNodePtr)0x0;
      }
    }
    else {
      pxVar5 = pxVar4->elem;
      if ((pxVar5 != (xmlNodePtr)0x0) && (pxVar5->type != XML_NAMESPACE_DECL)) {
        cur = pxVar4->inc;
        pxVar4->inc = (xmlNodePtr)0x0;
        if ((pxVar5->parent == (_xmlNode *)0x0) || (pxVar5->parent->type == XML_ELEMENT_NODE)) {
LAB_001abc67:
          pxVar7 = cur;
          if ((ctxt->parseFlags & 0x8000) == 0) {
            if (pxVar4->fallback != 0) {
              xmlUnsetProp(pxVar5,"href");
            }
            pxVar5->type = XML_XINCLUDE_START;
            p_Var11 = pxVar5->children;
            while (p_Var11 != (xmlNodePtr)0x0) {
              p_Var1 = p_Var11->next;
              xmlUnlinkNode(p_Var11);
              xmlFreeNode(p_Var11);
              p_Var11 = p_Var1;
            }
            pxVar7 = xmlNewDocNode(pxVar5->doc,pxVar5->ns,pxVar5->name,(xmlChar *)0x0);
            if (pxVar7 != (xmlNodePtr)0x0) {
              pxVar7->type = XML_XINCLUDE_END;
              pxVar8 = xmlAddNextSibling(pxVar5,pxVar7);
              pxVar5 = cur;
              if (pxVar8 != (xmlNodePtr)0x0) {
                do {
                  if (pxVar5 == (xmlNodePtr)0x0) goto LAB_001abd60;
                  cur = pxVar5->next;
                  pxVar9 = xmlAddPrevSibling(pxVar7,pxVar5);
                  pxVar8 = pxVar5;
                  pxVar5 = cur;
                } while (pxVar9 != (xmlNodePtr)0x0);
                goto LAB_001abd21;
              }
              goto LAB_001abd2c;
            }
          }
          else {
            do {
              if (pxVar7 == (xmlNodePtr)0x0) {
                xmlUnlinkNode(pxVar5);
                xmlFreeNode(pxVar5);
                goto LAB_001abd60;
              }
              cur = pxVar7->next;
              pxVar9 = xmlAddPrevSibling(pxVar5,pxVar7);
              pxVar8 = pxVar7;
              pxVar7 = cur;
            } while (pxVar9 != (xmlNodePtr)0x0);
LAB_001abd21:
            pxVar7 = pxVar8;
            xmlUnlinkNode(pxVar7);
LAB_001abd2c:
            xmlFreeNode(pxVar7);
          }
          xmlXIncludeErrMemory(ctxt);
        }
        else {
          iVar3 = 0;
          for (p_Var11 = cur; p_Var11 != (xmlNodePtr)0x0; p_Var11 = p_Var11->next) {
            iVar3 = iVar3 + (uint)(p_Var11->type == XML_ELEMENT_NODE);
          }
          if (iVar3 == 1) goto LAB_001abc67;
          pcVar10 = "XInclude error: would result in multiple root nodes\n";
          if (iVar3 == 0) {
            pcVar10 = "XInclude error: would result in no root node\n";
          }
          xmlXIncludeErr(ctxt,pxVar5,0x64b,pcVar10,(xmlChar *)0x0);
        }
        xmlFreeNodeList(cur);
      }
LAB_001abd60:
      ctxt->incTab[lVar12]->replace = 0;
    }
    iVar2 = iVar2 + 1;
    lVar12 = lVar12 + 1;
  } while( true );
}

Assistant:

static int
xmlXIncludeDoProcess(xmlXIncludeCtxtPtr ctxt, xmlNodePtr tree) {
    xmlXIncludeRefPtr ref;
    xmlNodePtr cur;
    int ret = 0;
    int i, start;

    /*
     * First phase: lookup the elements in the document
     */
    start = ctxt->incNr;
    cur = tree;
    do {
	/* TODO: need to work on entities -> stack */
        if (xmlXIncludeTestNode(ctxt, cur) == 1) {
            ref = xmlXIncludeExpandNode(ctxt, cur);
            /*
             * Mark direct includes.
             */
            if (ref != NULL)
                ref->replace = 1;
        } else if ((cur->children != NULL) &&
                   ((cur->type == XML_DOCUMENT_NODE) ||
                    (cur->type == XML_ELEMENT_NODE))) {
            cur = cur->children;
            continue;
        }
        do {
            if (cur == tree)
                break;
            if (cur->next != NULL) {
                cur = cur->next;
                break;
            }
            cur = cur->parent;
        } while (cur != NULL);
    } while ((cur != NULL) && (cur != tree));

    /*
     * Second phase: extend the original document infoset.
     */
    for (i = start; i < ctxt->incNr; i++) {
	if (ctxt->incTab[i]->replace != 0) {
            xmlXIncludeIncludeNode(ctxt, ctxt->incTab[i]);
            ctxt->incTab[i]->replace = 0;
        } else {
            /*
             * Ignore includes which were added indirectly, for example
             * inside xi:fallback elements.
             */
            if (ctxt->incTab[i]->inc != NULL) {
                xmlFreeNodeList(ctxt->incTab[i]->inc);
                ctxt->incTab[i]->inc = NULL;
            }
        }
	ret++;
    }

    if (ctxt->isStream) {
        /*
         * incTab references nodes which will eventually be deleted in
         * streaming mode. The table is only required for XPointer
         * expressions which aren't allowed in streaming mode.
         */
        for (i = 0;i < ctxt->incNr;i++) {
            xmlXIncludeFreeRef(ctxt->incTab[i]);
        }
        ctxt->incNr = 0;
    }

    return(ret);
}